

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

void Lit_PrintTT(uint *tt,int nVars)

{
  int level;
  ulong uVar1;
  
  level = (int)tt;
  for (uVar1 = (ulong)(uint)nVars; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    Abc_Print(level,"%08X",(ulong)tt[uVar1 - 1]);
  }
  return;
}

Assistant:

static inline void Lit_PrintTT(unsigned* tt, int nVars) {
    int w;
    for(w=nVars-1; w>=0; w--) {
            Abc_Print(-2, "%08X", tt[w]);
    }
}